

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::Test::RecordProperty(char *key,int value)

{
  int local_3c;
  undefined1 auStack_38 [4];
  int value_local;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  Message value_message;
  
  local_3c = value;
  Message::Message((Message *)&local_28);
  Message::operator<<((Message *)&local_28,&local_3c);
  internal::StringStreamToString((internal *)auStack_38,local_28.ptr_);
  RecordProperty(key,_auStack_38);
  internal::String::~String((String *)auStack_38);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_28);
  return;
}

Assistant:

void Test::RecordProperty(const char* key, int value) {
  Message value_message;
  value_message << value;
  RecordProperty(key, value_message.GetString().c_str());
}